

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O2

int UNPK_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *pvVar3;
  PHYSFS_sint64 PVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  pvVar3 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar3 == (void *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    PVar4 = 0;
    bVar5 = *(int *)((long)pvVar3 + 0x20) == 0;
    if (bVar5) {
      PVar4 = *(PHYSFS_sint64 *)((long)pvVar3 + 0x30);
    }
    stat->filetype = (uint)!bVar5;
    stat->filesize = PVar4;
    auVar1 = *(undefined1 (*) [16])((long)pvVar3 + 0x38);
    auVar6._0_8_ = auVar1._8_8_;
    auVar6._8_4_ = auVar1._0_4_;
    auVar6._12_4_ = auVar1._4_4_;
    stat->modtime = auVar6._0_8_;
    stat->createtime = auVar6._8_8_;
    stat->accesstime = -1;
    stat->readonly = 1;
  }
  return iVar2;
}

Assistant:

int UNPK_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    UNPKinfo *info = (UNPKinfo *) opaque;
    const UNPKentry *entry = findEntry(info, path);

    BAIL_IF_ERRPASS(!entry, 0);

    if (entry->tree.isdir)
    {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->filesize = 0;
    } /* if */
    else
    {
        stat->filetype = PHYSFS_FILETYPE_REGULAR;
        stat->filesize = entry->size;
    } /* else */

    stat->modtime = entry->mtime;
    stat->createtime = entry->ctime;
    stat->accesstime = -1;
    stat->readonly = 1;

    return 1;
}